

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
::QueryPoolGraphicStatisticsTest
          (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryInheritedTestInstance>
           *this,TestContext *context,char *name,char *description,
          ParametersGraphic parametersGraphic)

{
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  *this_00;
  allocator<char> local_26a;
  allocator<char> local_269;
  string local_268;
  string local_248;
  undefined1 *local_228;
  undefined1 *puStack_220;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [24];
  Vec4 local_120;
  Vec4 local_110;
  Vec4 local_100;
  Vec4 local_f0;
  Vec4 local_e0;
  Vec4 local_d0;
  Vec4 local_c0;
  Vec4 local_b0;
  Vec4 local_a0;
  Vec4 local_90;
  Vec4 local_80;
  Vec4 local_70;
  Vec4 local_60;
  Vec4 local_50;
  Vec4 local_40;
  Vec4 local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,name,&local_269);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"",&local_26a);
  TestCase::TestCase(&this->super_TestCase,context,&local_248,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__QueryPoolGraphicStatisticsTest_00bd72e0;
  this_00 = &this->m_data;
  (this->m_data).
  super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).
  super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).
  super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_parametersGraphic = (ParametersGraphic)description;
  local_138._0_4_ = -1.0;
  local_138._4_4_ = -1.0;
  local_138._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xff0000ff;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_138,&local_30);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_148._0_4_ = -1.0;
  local_148._4_4_ = 0.0;
  local_148._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xff0000ff;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_148,&local_40);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_158._0_4_ = 0.0;
  local_158._4_4_ = -1.0;
  local_158._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xff0000ff;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_158,&local_50);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_168._0_4_ = 0.0;
  local_168._4_4_ = 0.0;
  local_168._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xff0000ff;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_168,&local_60);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_178._0_4_ = -1.0;
  local_178._4_4_ = 0.0;
  local_178._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_178,&local_70);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_188._0_4_ = -1.0;
  local_188._4_4_ = 1.0;
  local_188._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_188,&local_80);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_198._0_4_ = 0.0;
  local_198._4_4_ = 0.0;
  local_198._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_198,&local_90);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_1a8._0_4_ = 0.0;
  local_1a8._4_4_ = 1.0;
  local_1a8._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_1a8,&local_a0);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_1b8._0_4_ = 0.0;
  local_1b8._4_4_ = -1.0;
  local_1b8._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_1b8,&local_b0);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_1c8._0_4_ = 0.0;
  local_1c8._4_4_ = 0.0;
  local_1c8._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_1c8,&local_c0);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_1d8._0_4_ = 1.0;
  local_1d8._4_4_ = -1.0;
  local_1d8._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_1d8,&local_d0);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_1e8._0_4_ = 1.0;
  local_1e8._4_4_ = 0.0;
  local_1e8._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xffff0000;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_1e8,&local_e0);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_1f8._0_4_ = 0.0;
  local_1f8._4_4_ = 0.0;
  local_1f8._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xff808080;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_1f8,&local_f0);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_208._0_4_ = 0.0;
  local_208._4_4_ = 1.0;
  local_208._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xff808080;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_208,&local_100);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_218._0_4_ = 1.0;
  local_218._4_4_ = 0.0;
  local_218._8_8_ = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xff808080;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)local_218,&local_110);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  local_228 = &DAT_3f8000003f800000;
  puStack_220 = &DAT_3f8000003f800000;
  local_268._M_dataplus._M_p._0_4_ = 0xff808080;
  tcu::RGBA::toVec((RGBA *)&local_268);
  GraphicBasicTestInstance::VertexData::VertexData
            ((VertexData *)&local_248,(Vec4 *)&local_228,&local_120);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,(value_type *)&local_248);
  return;
}

Assistant:

QueryPoolGraphicStatisticsTest (tcu::TestContext &context, const char *name, const char *description, const GraphicBasicTestInstance::ParametersGraphic parametersGraphic)
		: TestCase				(context, name, description)
		, m_parametersGraphic	(parametersGraphic)
	{
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
	}